

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeIndirectComputeDispatchTests.cpp
# Opt level: O3

void __thiscall
vkt::compute::anon_unknown_1::IndirectDispatchCaseBufferUpload::IndirectDispatchCaseBufferUpload
          (IndirectDispatchCaseBufferUpload *this,TestContext *testCtx,DispatchCaseDesc *caseDesc,
          GLSLVersion glslVersion)

{
  int i;
  long lVar1;
  allocator<char> local_5a;
  allocator<char> local_59;
  long *local_58 [2];
  long local_48 [2];
  long *local_38 [2];
  long local_28 [2];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,caseDesc->m_name,&local_59);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_58,caseDesc->m_description,&local_5a);
  tcu::TestCase::TestCase((TestCase *)this,testCtx,(char *)local_38[0],(char *)local_58[0]);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_00cec1f0;
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__IndirectDispatchCaseBufferUpload_00cfd8c0;
  this->m_bufferSize = caseDesc->m_bufferSize;
  lVar1 = 0;
  do {
    (this->m_workGroupSize).m_data[lVar1] = (caseDesc->m_workGroupSize).m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  std::
  vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
  ::vector(&this->m_dispatchCommands,&caseDesc->m_dispatchCommands);
  this->m_glslVersion = GLSL_VERSION_310_ES;
  return;
}

Assistant:

IndirectDispatchCaseBufferUpload::IndirectDispatchCaseBufferUpload (tcu::TestContext&		testCtx,
																	const DispatchCaseDesc& caseDesc,
																	const glu::GLSLVersion	glslVersion)
	: vkt::TestCase			(testCtx, caseDesc.m_name, caseDesc.m_description)
	, m_bufferSize			(caseDesc.m_bufferSize)
	, m_workGroupSize		(caseDesc.m_workGroupSize)
	, m_dispatchCommands	(caseDesc.m_dispatchCommands)
	, m_glslVersion			(glslVersion)
{
}